

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O1

void mqc_restart_init_enc(opj_mqc_t *mqc)

{
  uchar *puVar1;
  
  mqc->curctx = mqc->ctxs;
  mqc->c = 0;
  mqc->a = 0x8000;
  mqc->ct = 0xc;
  puVar1 = mqc->bp;
  mqc->bp = puVar1 + -1;
  if (puVar1[-1] != 0xff) {
    return;
  }
  mqc->ct = 0xd;
  return;
}

Assistant:

void mqc_restart_init_enc(opj_mqc_t *mqc) {
	/* <Re-init part> */
	mqc_setcurctx(mqc, 0);
	mqc->a = 0x8000;
	mqc->c = 0;
	mqc->ct = 12;
	mqc->bp--;
	if (*mqc->bp == 0xff) {
		mqc->ct = 13;
	}
}